

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int64_t atol8(char *p,uint char_cnt)

{
  ulong uStack_28;
  int digit;
  int64_t l;
  char *pcStack_18;
  uint char_cnt_local;
  char *p_local;
  
  uStack_28 = 0;
  l._4_4_ = char_cnt;
  for (pcStack_18 = p; ((l._4_4_ != 0 && ('/' < *pcStack_18)) && (*pcStack_18 < '8'));
      pcStack_18 = pcStack_18 + 1) {
    uStack_28 = (long)(*pcStack_18 + -0x30) | uStack_28 << 3;
    l._4_4_ = l._4_4_ - 1;
  }
  return uStack_28;
}

Assistant:

static int64_t
atol8(const char *p, unsigned char_cnt)
{
	int64_t l;
	int digit;

	l = 0;
	while (char_cnt-- > 0) {
		if (*p >= '0' && *p <= '7')
			digit = *p - '0';
		else
			return (l);
		p++;
		l <<= 3;
		l |= digit;
	}
	return (l);
}